

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-export.cc
# Opt level: O1

bool tinyusdz::tydra::export_to_obj
               (RenderScene *scene,int mesh_id,string *obj_str,string *mtl_str,string *warn,
               string *err)

{
  size_type *psVar1;
  __node_base_ptr *pp_Var2;
  __node_base_ptr *pp_Var3;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *this;
  VertexVariability VVar4;
  pointer puVar5;
  size_type sVar6;
  pointer puVar7;
  pointer pRVar8;
  pointer pUVar9;
  pointer pTVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar12;
  undefined8 uVar13;
  RenderScene *pRVar14;
  pointer pRVar15;
  ulong uVar16;
  ostream *poVar17;
  size_type sVar18;
  mapped_type *this_00;
  undefined7 uVar28;
  size_t sVar19;
  pointer puVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar21;
  mapped_type *pmVar22;
  size_type sVar23;
  _Alloc_hider _Var24;
  _Base_ptr p_Var25;
  undefined8 *puVar26;
  long *plVar27;
  ulong uVar29;
  pointer pRVar30;
  int iVar31;
  pointer pRVar32;
  pointer pRVar33;
  undefined8 uVar34;
  long lVar35;
  byte bVar36;
  uint uVar37;
  long lVar38;
  char *pcVar39;
  string *psVar40;
  long lVar41;
  float *pfVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  subset_face_ids;
  int32_t texId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids;
  int64_t imageId;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  face_groups;
  ostringstream ss_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  stringstream ss;
  key_type local_490;
  string *local_470;
  undefined1 local_468 [32];
  float local_448;
  size_t local_440;
  __node_base_ptr p_Stack_438;
  pointer local_430;
  RenderScene *local_428;
  undefined1 local_41c [4];
  string local_418;
  string local_3f0;
  undefined4 local_3cc;
  pointer local_3c8;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined1 local_3b4 [4];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [40];
  ulong local_378;
  undefined1 local_370 [16];
  _Alloc_hider local_360;
  size_type local_358;
  ios_base local_300 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  string *local_1e0;
  _Base_ptr local_1d8;
  _Base_ptr local_1d0;
  _Base_ptr local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_3b4 = (undefined1  [4])mesh_id;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  uVar16 = (ulong)(int)local_3b4;
  if ((long)uVar16 < 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"export_to_obj",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
    poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x26);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"Invalid mesh_id",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"\n",1);
LAB_00320e13:
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      plVar27 = (long *)::std::__cxx11::string::append(local_468);
      pRVar33 = (pointer)(plVar27 + 2);
      if ((pointer)*plVar27 == pRVar33) {
        local_3a0._0_8_ = (pRVar33->prim_name)._M_dataplus._M_p;
        local_3a0._8_8_ = plVar27[3];
        local_3b0._0_8_ = (pointer)local_3a0;
      }
      else {
        local_3a0._0_8_ = (pRVar33->prim_name)._M_dataplus._M_p;
        local_3b0._0_8_ = (pointer)*plVar27;
      }
      local_3b0._8_8_ = plVar27[1];
      *plVar27 = (long)pRVar33;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)err,local_3b0._0_8_);
      if ((pointer)local_3b0._0_8_ != (pointer)local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
LAB_003210a6:
        operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
      }
    }
LAB_003210b3:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
    ::std::ios_base::~ios_base(local_300);
  }
  else {
    pRVar33 = (scene->meshes).
              super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar29 = ((long)(scene->meshes).
                    super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar33 >> 5) *
             -0x7063e7063e7063e7;
    local_470 = err;
    if (uVar29 < uVar16 || uVar29 - uVar16 == 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_370,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"export_to_obj",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
      poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x28);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
      pp_Var2 = (__node_base_ptr *)(local_468 + 0x10);
      local_468._0_8_ = pp_Var2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"mesh_id {} is out-of-range. scene.meshes.size {}","");
      local_490._M_dataplus._M_p =
           (pointer)(((long)(scene->meshes).
                            super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(scene->meshes).
                            super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x7063e7063e7063e7);
      fmt::format<int,unsigned_long>
                ((string *)local_3b0,(fmt *)local_468,(string *)local_3b4,(int *)&local_490,
                 (unsigned_long *)warn);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,(char *)local_3b0._0_8_,local_3b0._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      if ((pointer)local_3b0._0_8_ != (pointer)local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      if ((__node_base_ptr *)local_468._0_8_ != pp_Var2) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
      }
      if (local_470 != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        plVar27 = (long *)::std::__cxx11::string::append(local_468);
        pRVar33 = (pointer)(plVar27 + 2);
        if ((pointer)*plVar27 == pRVar33) {
          local_3a0._0_8_ = (pRVar33->prim_name)._M_dataplus._M_p;
          local_3a0._8_8_ = plVar27[3];
          local_3b0._0_8_ = (pointer)local_3a0;
        }
        else {
          local_3a0._0_8_ = (pRVar33->prim_name)._M_dataplus._M_p;
          local_3b0._0_8_ = (pointer)*plVar27;
        }
        local_3b0._8_8_ = plVar27[1];
        *plVar27 = (long)pRVar33;
        plVar27[1] = 0;
        *(undefined1 *)(plVar27 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_470,local_3b0._0_8_);
        if ((pointer)local_3b0._0_8_ != (pointer)local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        if ((__node_base_ptr *)local_468._0_8_ != pp_Var2) goto LAB_003210a6;
      }
      goto LAB_003210b3;
    }
    local_3c8 = pRVar33 + uVar16;
    local_428 = scene;
    local_1e0 = mtl_str;
    local_1d8 = (_Base_ptr)obj_str;
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"# exported from TinyUSDZ Tydra.\n",0x20);
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"mtllib ",7);
    poVar17 = (ostream *)::std::ostream::operator<<(local_1a8,(int)local_3b4);
    _Var24._M_p = pRVar33[uVar16].prim_name._M_dataplus._M_p;
    local_370._0_8_ = &local_360;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_370,_Var24._M_p,
               _Var24._M_p + pRVar33[uVar16].prim_name._M_string_length);
    ::std::__cxx11::string::append((char *)local_370);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,(char *)local_370._0_8_,local_370._8_8_);
    if ((_Alloc_hider *)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_p + 1));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    pRVar33 = local_3c8;
    if (*(pointer *)
         ((long)&(local_3c8->points).
                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                 ._M_impl + 8) !=
        (local_3c8->points).
        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      lVar38 = 0;
      uVar16 = 0;
      do {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"v ",2);
        poVar17 = ::std::ostream::_M_insert<double>
                            ((double)*(float *)(*(long *)&(pRVar33->points).
                                                                                                                    
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar38));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        poVar17 = ::std::ostream::_M_insert<double>
                            ((double)*(float *)(*(long *)&(pRVar33->points).
                                                                                                                    
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar38));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        poVar17 = ::std::ostream::_M_insert<double>
                            ((double)*(float *)(*(long *)&(pRVar33->points).
                                                                                                                    
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + 8 + lVar38));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
        uVar16 = uVar16 + 1;
        lVar38 = lVar38 + 0xc;
      } while (uVar16 < (ulong)(((long)*(pointer *)
                                        ((long)&(pRVar33->points).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl + 8) -
                                 *(long *)&(pRVar33->points).
                                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                           ._M_impl.super__Vector_impl_data >> 2) *
                               -0x5555555555555555));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"# ",2);
    poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," vertices\n",10);
    pRVar30 = (pointer)((long)*(pointer *)
                               ((long)&(pRVar33->points).
                                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                       ._M_impl + 8) -
                        *(long *)&(pRVar33->points).
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data >> 2);
    pRVar32 = (pointer)(long)(pRVar33->joint_and_weights).elementSize;
    local_3f0.field_2._8_8_ = pRVar32;
    if (((long)*(pointer *)
                ((long)&(pRVar33->joint_and_weights).jointWeights.
                        super__Vector_base<float,_std::allocator<float>_> + 8) -
         *(long *)&(pRVar33->joint_and_weights).jointWeights.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl >> 2 ==
         (long)pRVar32 * -0x5555555555555555 * (long)pRVar30) &&
       (pRVar30 = local_3c8,
       *(pointer *)
        ((long)&(local_3c8->points).
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl + 8) !=
       (local_3c8->points).
       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
       super__Vector_impl_data._M_start)) {
      local_378 = (long)pRVar32 << 2;
      local_430 = (pointer)0x0;
      pRVar33 = (pointer)0x0;
      do {
        local_3f0.field_2._M_allocated_capacity = (size_type)pRVar33;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vw ",3);
        pRVar15 = local_3c8;
        if (local_3f0.field_2._8_4_ != 0) {
          lVar38 = 0;
          pRVar33 = local_430;
          do {
            bVar44 = lVar38 != 0;
            lVar38 = lVar38 + -1;
            if (bVar44) {
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
            }
            poVar17 = (ostream *)
                      ::std::ostream::operator<<
                                (local_1a8,
                                 *(int *)((long)&(pRVar33->prim_name)._M_dataplus._M_p +
                                         *(long *)&(pRVar15->joint_and_weights).jointIndices.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            ::std::ostream::_M_insert<double>
                      ((double)*(float *)((long)&(pRVar33->prim_name)._M_dataplus._M_p +
                                         *(long *)&(pRVar15->joint_and_weights).jointWeights.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl));
            pRVar33 = (pointer)((long)&(pRVar33->prim_name)._M_dataplus._M_p + 4);
          } while ((pointer)-lVar38 != pRVar32);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
        pRVar33 = (pointer)(local_3f0.field_2._M_allocated_capacity + 1);
        pRVar30 = (pointer)((long)&(local_430->prim_name)._M_dataplus._M_p + local_378);
        local_430 = pRVar30;
      } while (pRVar33 < (pointer)(((long)*(pointer *)
                                           ((long)&(pRVar15->points).
                                                                                                      
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl + 8) -
                                    *(long *)&(pRVar15->points).
                                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data >> 2) *
                                  -0x5555555555555555));
    }
    pRVar33 = local_3c8;
    this = &local_3c8->texcoords;
    local_370._0_8_ = local_370._0_8_ & 0xffffffff00000000;
    sVar18 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&this->_M_h,(key_type_conflict1 *)local_370);
    if (sVar18 == 0) {
      local_378 = local_378 & 0xffffffff00000000;
      local_3cc = 0;
LAB_0032134f:
      puVar5 = (pRVar33->normals).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar32 = pRVar33;
      if (puVar5 == *(pointer *)
                     ((long)&(pRVar33->normals).data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8))
      {
        local_3b8 = 0;
LAB_00321485:
        local_3bc = 0;
      }
      else {
        VVar4 = (pRVar33->normals).variability;
        if (VVar4 == FaceVarying) {
          local_3b8 = 1;
        }
        else {
          if (VVar4 != Vertex) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_370,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_370,"export_to_obj",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,100);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_370,
                       "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0"
                       ,0x49);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"\n",1);
            err = local_470;
            goto LAB_00320e13;
          }
          local_3b8 = 0;
        }
        if ((pRVar33->normals).format != Vec3) goto LAB_00321485;
        sVar19 = VertexAttribute::vertex_count(&pRVar33->normals);
        local_3bc = (undefined4)CONCAT71((int7)((ulong)pRVar30 >> 8),1);
        if (sVar19 != 0) {
          pfVar42 = (float *)(puVar5 + 8);
          uVar16 = 0;
          do {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vn ",3);
            poVar17 = ::std::ostream::_M_insert<double>((double)pfVar42[-2]);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            poVar17 = ::std::ostream::_M_insert<double>((double)pfVar42[-1]);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            poVar17 = ::std::ostream::_M_insert<double>((double)*pfVar42);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            uVar16 = uVar16 + 1;
            sVar19 = VertexAttribute::vertex_count(&pRVar33->normals);
            pfVar42 = pfVar42 + 3;
            pRVar32 = local_3c8;
          } while (uVar16 < sVar19);
        }
      }
      local_3b0._0_8_ = local_3a0 + 0x20;
      local_3b0._8_8_ = 1;
      local_3a0._0_8_ = (pointer)0x0;
      local_3a0._8_8_ = 0;
      local_3a0._16_4_ = 0x3f800000;
      local_3a0._24_8_ = 0;
      local_3a0._32_8_ = (pointer)0x0;
      if (*(size_t *)((long)&(pRVar32->material_subsetMap)._M_t._M_impl + 0x28) == 0) {
        lVar38 = 200;
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexCounts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar38 = 0x98;
        }
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexIndices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar38 = 0x98;
        }
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_490,
                   *(long *)((long)&(pRVar32->prim_name)._M_string_length + lVar38) -
                   *(long *)((long)&(pRVar32->prim_name)._M_dataplus._M_p + lVar38) >> 2,
                   (allocator_type *)local_370);
        if (local_490._M_dataplus._M_p != (pointer)local_490._M_string_length) {
          iVar31 = 0;
          _Var24._M_p = local_490._M_dataplus._M_p;
          do {
            *(int *)_Var24._M_p = iVar31;
            iVar31 = iVar31 + 1;
            _Var24._M_p = _Var24._M_p + 4;
          } while (_Var24._M_p != (pointer)local_490._M_string_length);
        }
        local_370._0_4_ = pRVar32->material_id;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_370 + 8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_490);
        local_468._0_8_ = local_468 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"");
        pmVar22 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_3b0,(key_type *)local_468);
        pmVar22->first = local_370._0_4_;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  (&pmVar22->second,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_370 + 8));
        if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
          operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
        }
        if ((void *)local_370._8_8_ != (void *)0x0) {
          operator_delete((void *)local_370._8_8_,local_358 - local_370._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_490._M_dataplus._M_p,
                          local_490.field_2._M_allocated_capacity - (long)local_490._M_dataplus._M_p
                         );
        }
LAB_00321b42:
        lVar35 = 200;
        lVar38 = 0x98;
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexCounts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) !=
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar38 = 200;
        }
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexIndices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar38 = 0x98;
        }
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,
                   *(long *)((long)&(pRVar32->prim_name)._M_string_length + lVar38) -
                   *(long *)((long)&(pRVar32->prim_name)._M_dataplus._M_p + lVar38) >> 2,
                   (allocator_type *)local_370);
        puVar20 = *(pointer *)
                   &(pRVar32->triangulatedFaceVertexIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexCounts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar35 = 0x98;
        }
        puVar7 = *(pointer *)
                  ((long)&(pRVar32->triangulatedFaceVertexIndices).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8);
        if (puVar7 == puVar20) {
          lVar35 = 0x98;
        }
        if (*(long *)((long)&(pRVar32->prim_name)._M_string_length + lVar35) !=
            *(long *)((long)&(pRVar32->prim_name)._M_dataplus._M_p + lVar35)) {
          lVar38 = 0;
          psVar40 = (string *)0x0;
          do {
            *(long *)(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + (long)psVar40 * 2) = lVar38;
            lVar35 = 200;
            if (*(pointer *)
                 ((long)&(pRVar32->triangulatedFaceVertexCounts).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8
                 ) == *(pointer *)
                       &(pRVar32->triangulatedFaceVertexCounts).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
              lVar35 = 0x98;
            }
            lVar41 = 0x98;
            if (puVar7 != puVar20) {
              lVar41 = lVar35;
            }
            lVar35 = *(long *)((long)&(pRVar32->prim_name)._M_dataplus._M_p + lVar41);
            lVar38 = lVar38 + (ulong)*(uint *)(lVar35 + (long)psVar40 * 4);
            psVar40 = (string *)((long)&(psVar40->_M_dataplus)._M_p + 1);
            warn = (string *)
                   (*(long *)((long)&(pRVar32->prim_name)._M_string_length + lVar41) - lVar35 >> 2);
          } while (psVar40 < warn);
        }
        pRVar33 = (pointer)local_3a0._0_8_;
        if ((pointer)local_3a0._0_8_ != (pointer)0x0) {
          local_3f0._M_string_length._7_1_ = (byte)local_3cc & (byte)local_3bc;
          local_430 = (pointer)0x0;
          local_3f0.field_2._M_allocated_capacity =
               (size_type)&pRVar32->triangulatedFaceVertexCounts;
          local_3f0.field_2._8_8_ = &pRVar32->usdFaceVertexCounts;
          local_1c8 = (_Base_ptr)&pRVar32->usdFaceVertexIndices;
          local_1d0 = (_Base_ptr)&pRVar32->triangulatedFaceVertexIndices;
          do {
            if ((pointer)(pRVar33->prim_name).field_2._M_allocated_capacity != (pointer)0x0) {
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"g ",2);
              poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)(pRVar33->prim_name)._M_string_length,
                                   (long)(pRVar33->prim_name).field_2._M_allocated_capacity);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            }
            lVar38 = (long)*(int *)&(pRVar33->abs_path)._M_string_length;
            if (-1 < lVar38) {
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"usemtl ",7);
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,pRVar8[lVar38].name._M_dataplus._M_p,
                                   pRVar8[lVar38].name._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            }
            if (*(size_type *)((long)&(pRVar33->abs_path).field_2 + 8) !=
                (pRVar33->abs_path).field_2._M_allocated_capacity) {
              uVar16 = 0;
              do {
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"f ",2);
                bVar45 = *(pointer *)
                          ((long)&(pRVar32->triangulatedFaceVertexIndices).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + 8) !=
                         *(pointer *)
                          &(pRVar32->triangulatedFaceVertexIndices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
                bVar46 = *(pointer *)
                          ((long)&(pRVar32->triangulatedFaceVertexCounts).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + 8) !=
                         *(pointer *)
                          &(pRVar32->triangulatedFaceVertexCounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
                bVar44 = bVar46 && bVar45;
                uVar34 = local_3f0.field_2._8_8_;
                if (bVar46 && bVar45) {
                  uVar34 = local_3f0.field_2._M_allocated_capacity;
                }
                uVar29 = (ulong)*(uint *)((pRVar33->abs_path).field_2._M_allocated_capacity +
                                         uVar16 * 4);
                if (*(int *)(*(long *)&((_Vector_impl *)&(((pointer)uVar34)->prim_name)._M_dataplus)
                                       ->super__Vector_impl_data + uVar29 * 4) != 0) {
                  uVar43 = 0;
                  local_1c0 = uVar16;
                  do {
                    if (uVar43 != 0) {
                      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
                    }
                    poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    if (local_3f0._M_string_length._7_1_ == 0) {
                      if ((char)local_3cc != '\0') {
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"/",1);
                        goto LAB_00321ed7;
                      }
                      if ((byte)local_3bc != '\0') {
                        lVar38 = 2;
                        pcVar39 = "//";
                        goto LAB_00321eab;
                      }
                    }
                    else {
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"/",1);
                      poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
                      lVar38 = 1;
                      pcVar39 = "/";
                      uVar16 = local_1c0;
LAB_00321eab:
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar39,lVar38);
LAB_00321ed7:
                      ::std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
                    }
                    uVar43 = uVar43 + 1;
                    bVar45 = *(pointer *)
                              ((long)&(local_3c8->triangulatedFaceVertexIndices).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + 8) !=
                             *(pointer *)
                              &(local_3c8->triangulatedFaceVertexIndices).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl;
                    bVar46 = *(pointer *)
                              ((long)&(local_3c8->triangulatedFaceVertexCounts).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + 8) !=
                             *(pointer *)
                              &(local_3c8->triangulatedFaceVertexCounts).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl;
                    bVar44 = bVar46 && bVar45;
                    uVar34 = local_3f0.field_2._8_8_;
                    if (bVar46 && bVar45) {
                      uVar34 = local_3f0.field_2._M_allocated_capacity;
                    }
                    uVar29 = (ulong)*(uint *)((pRVar33->abs_path).field_2._M_allocated_capacity +
                                             uVar16 * 4);
                    pRVar32 = local_3c8;
                  } while (uVar43 < *(uint *)(*(long *)&((_Vector_impl *)
                                                        &(((pointer)uVar34)->prim_name)._M_dataplus)
                                                        ->super__Vector_impl_data + uVar29 * 4));
                }
                p_Var25 = local_1c8;
                if (bVar44) {
                  p_Var25 = local_1d0;
                }
                local_430 = (pointer)((long)&(local_430->prim_name)._M_dataplus._M_p +
                                     (ulong)*(uint *)(*(long *)p_Var25 + uVar29 * 4));
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                uVar16 = uVar16 + 1;
              } while (uVar16 < (ulong)((long)(*(long *)((long)&(pRVar33->abs_path).field_2 + 8) -
                                              (pRVar33->abs_path).field_2._M_allocated_capacity) >>
                                       2));
            }
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
            pRVar33 = *(pointer *)
                       &((_Vector_impl *)&(pRVar33->prim_name)._M_dataplus)->super__Vector_impl_data
            ;
          } while (pRVar33 != (pointer)0x0);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)local_1d8,(string *)local_370);
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_370._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)&local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_p + 1));
        }
        local_370._0_8_ =
             (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_360;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"");
        ::std::__cxx11::stringbuf::str(local_1a0);
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_370._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)&local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_p + 1));
        }
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"# exported from TinyUSDZ Tydra.\n",0x20);
        bVar44 = (pointer)local_3a0._0_8_ == (pointer)0x0;
        uVar16 = CONCAT71((int7)((ulong)pRVar33 >> 8),bVar44);
        uVar34 = local_3a0._0_8_;
        while (!bVar44) {
          uVar29 = (ulong)*(uint *)&(((pointer)uVar34)->abs_path)._M_string_length;
          if (uVar29 == 0xffffffff) {
            iVar31 = 0x2f;
          }
          else {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"newmtl ",7);
            pRVar14 = local_428;
            pRVar8 = (local_428->materials).
                     super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,pRVar8[uVar29].name._M_dataplus._M_p,
                                 pRVar8[uVar29].name._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            pRVar8 = (pRVar14->materials).
                     super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pRVar8[uVar29].surfaceShader.diffuseColor.texture_id < 0) {
              local_3f0.field_2._8_8_ =
                   (undefined8)pRVar8[uVar29].surfaceShader.diffuseColor.value._M_elems[0];
              local_3f0.field_2._M_allocated_capacity =
                   (size_type)
                   (double)*(float *)((long)&pRVar8[uVar29].surfaceShader.diffuseColor.value + 4);
              local_430 = (pointer)(double)*(float *)((long)&pRVar8[uVar29].surfaceShader.
                                                             diffuseColor.value + 8);
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Kd ",3);
              poVar17 = ::std::ostream::_M_insert<double>((double)local_3f0.field_2._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              poVar17 = ::std::ostream::_M_insert<double>
                                  ((double)local_3f0.field_2._M_allocated_capacity);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
LAB_0032248b:
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar37 = (uint)uVar16;
              if (pRVar8[uVar29].surfaceShader.useSpecularWorkflow == true) {
                if (pRVar8[uVar29].surfaceShader.specularColor.texture_id < 0) {
                  local_430 = (pointer)CONCAT44(local_430._4_4_,
                                                *(float *)((long)&pRVar8[uVar29].surfaceShader.
                                                                  specularColor.value + 8));
                  local_3f0.field_2._8_8_ =
                       (undefined8)pRVar8[uVar29].surfaceShader.specularColor.value._M_elems[0];
                  local_3f0.field_2._M_allocated_capacity =
                       (size_type)
                       (double)*(float *)((long)&pRVar8[uVar29].surfaceShader.specularColor.value +
                                         4);
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ks ",3);
                  poVar17 = ::std::ostream::_M_insert<double>((double)local_3f0.field_2._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  poVar17 = ::std::ostream::_M_insert<double>
                                      ((double)local_3f0.field_2._M_allocated_capacity);
                  lVar38 = 1;
                  pcVar39 = " ";
LAB_00322a08:
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar39,lVar38);
                  poVar17 = ::std::ostream::_M_insert<double>((double)local_430._0_4_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  goto LAB_00322a2e;
                }
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.specularColor.texture_id;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0xf0;
                  goto LAB_00324867;
                }
                local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if ((-1 < (long)local_3f0._M_dataplus._M_p) &&
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) !=
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  local_468._0_8_ = local_468 + 0x10;
                  _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                                _M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var24._M_p,
                             _Var24._M_p +
                             pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                             _M_string_length);
                  pRVar33 = (pointer)local_468._8_8_;
                  if ((pointer)local_468._8_8_ != (pointer)0x0) {
                    pcVar39 = "map_Ks ";
                    goto LAB_00322682;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0xfa;
LAB_0032388b:
                  poVar17 = (ostream *)::std::ostream::operator<<((ostream *)local_370,iVar31);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  uVar37 = (uint)local_430._0_4_;
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                  goto LAB_00323deb;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                iVar31 = 0xf5;
LAB_00322ed3:
                poVar17 = (ostream *)::std::ostream::operator<<((ostream *)local_370,iVar31);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_490,"Invalid image id {}. scene.images.size = {}","");
                local_418._M_dataplus._M_p =
                     (pointer)(((long)(local_428->images).
                                      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_428->images).
                                      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x3333333333333333);
                fmt::format<long,unsigned_long>
                          ((string *)local_468,(fmt *)&local_490,&local_3f0,(long *)(local_41c + 4),
                           (unsigned_long *)warn);
                poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                uVar16 = (ulong)local_430 & 0xffffffff;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) goto LAB_00322376;
LAB_00322383:
                if (local_470 == (string *)0x0) goto LAB_00325ca1;
                ::std::__cxx11::stringbuf::str();
                plVar27 = (long *)::std::__cxx11::string::append((char *)&local_490);
                pp_Var2 = (__node_base_ptr *)(plVar27 + 2);
                if ((__node_base_ptr *)*plVar27 == pp_Var2) {
                  local_468._16_8_ = *pp_Var2;
                  local_468._24_8_ = plVar27[3];
                  local_468._0_8_ = local_468 + 0x10;
                }
                else {
                  local_468._16_8_ = *pp_Var2;
                  local_468._0_8_ = (__node_base_ptr *)*plVar27;
                }
                local_468._8_8_ = plVar27[1];
                *plVar27 = (long)pp_Var2;
                plVar27[1] = 0;
                *(undefined1 *)(plVar27 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_470,local_468._0_8_);
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) goto LAB_00322806;
                goto LAB_00322813;
              }
              if (pRVar8[uVar29].surfaceShader.metallic.texture_id < 0) {
                local_430 = (pointer)CONCAT44(local_430._4_4_,
                                              pRVar8[uVar29].surfaceShader.metallic.value);
                lVar38 = 3;
                poVar17 = local_1a8;
                pcVar39 = "Pm ";
                goto LAB_00322a08;
              }
              local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.metallic.texture_id;
              if (((long)(int)local_41c < 0) ||
                 (pUVar9 = (local_428->textures).
                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                 (int)((ulong)((long)(local_428->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 3
                      ) * 0x2fa0be83 <= (int)local_41c)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                iVar31 = 0x106;
                goto LAB_00324867;
              }
              local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
              local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
              if (((long)local_3f0._M_dataplus._M_p < 0) ||
                 (pTVar10 = (local_428->images).
                            super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 lVar38 = (long)(local_428->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                 SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                 (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                iVar31 = 0x10b;
                goto LAB_00322ed3;
              }
              local_468._0_8_ = local_468 + 0x10;
              _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus.
                            _M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_468,_Var24._M_p,
                         _Var24._M_p +
                         pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_string_length
                        );
              pRVar33 = (pointer)local_468._8_8_;
              if ((pointer)local_468._8_8_ == (pointer)0x0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                iVar31 = 0x110;
                goto LAB_0032388b;
              }
              pcVar39 = "map_Pm ";
LAB_00322682:
              pRVar33 = (pointer)local_468._8_8_;
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar39,7);
              poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              uVar37 = (uint)local_430._0_4_;
LAB_00323deb:
              uVar16 = (ulong)uVar37;
              if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
              if (pRVar33 == (pointer)0x0) goto LAB_003260f3;
LAB_00322a2e:
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (-1 < pRVar8[uVar29].surfaceShader.roughness.texture_id) {
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.roughness.texture_id;
                uVar37 = (uint)uVar16;
                if ((-1 < (long)(int)local_41c) &&
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)local_41c <
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83)) {
                  local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                  if (((long)local_3f0._M_dataplus._M_p < 0) ||
                     (pTVar10 = (local_428->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     lVar38 = (long)(local_428->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                     SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                     (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,"():",3);
                    iVar31 = 0x121;
                    goto LAB_00322738;
                  }
                  local_468._0_8_ = local_468 + 0x10;
                  _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                                _M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_468,_Var24._M_p,
                             _Var24._M_p +
                             pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                             _M_string_length);
                  uVar13 = local_468._8_8_;
                  if ((pointer)local_468._8_8_ == (pointer)0x0) {
                    local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,"export_to_obj",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_370,"():",3);
                    poVar17 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_370,0x126);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                    fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_370,local_490._M_dataplus._M_p,
                                         local_490._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                    uVar16 = (ulong)local_430 & 0xffffffff;
                    if (local_470 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                      psVar1 = (size_type *)(plVar27 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar27 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490.field_2._8_8_ = plVar27[3];
                        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      }
                      else {
                        local_490.field_2._M_allocated_capacity = *psVar1;
                        local_490._M_dataplus._M_p = (pointer)*plVar27;
                      }
                      local_490._M_string_length = plVar27[1];
                      *plVar27 = (long)psVar1;
                      plVar27[1] = 0;
                      *(undefined1 *)(plVar27 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_418._M_dataplus._M_p != &local_418.field_2) {
                        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                    ::std::ios_base::~ios_base(local_300);
                  }
                  else {
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Pr ",7);
                    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  if ((pointer)uVar13 == (pointer)0x0) goto LAB_003260f3;
                  goto LAB_00322c29;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                iVar31 = 0x11c;
LAB_00324867:
                poVar17 = (ostream *)::std::ostream::operator<<(local_370,iVar31);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_490,"Invalid texture id {}. scene.textures.size = {}",""
                          );
                local_418._M_dataplus._M_p =
                     (pointer)(((long)(local_428->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_428->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x7d05f417d05f417d);
                fmt::format<int,unsigned_long>
                          ((string *)local_468,(fmt *)&local_490,(string *)local_41c,
                           (int *)(local_41c + 4),(unsigned_long *)warn);
                goto LAB_003248ef;
              }
              local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.roughness.value;
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pr ",3);
              poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
LAB_00322c29:
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pRVar8[uVar29].surfaceShader.emissiveColor.texture_id < 0) {
                local_3f0.field_2._8_8_ =
                     (undefined8)pRVar8[uVar29].surfaceShader.emissiveColor.value._M_elems[0];
                local_3f0.field_2._M_allocated_capacity =
                     (size_type)
                     (double)*(float *)((long)&pRVar8[uVar29].surfaceShader.emissiveColor.value + 4)
                ;
                local_430 = (pointer)(double)*(float *)((long)&pRVar8[uVar29].surfaceShader.
                                                               emissiveColor.value + 8);
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ke ",3);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_3f0.field_2._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                poVar17 = ::std::ostream::_M_insert<double>
                                    ((double)local_3f0.field_2._M_allocated_capacity);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              }
              else {
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.emissiveColor.texture_id;
                uVar37 = (uint)uVar16;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x131;
                  goto LAB_00324867;
                }
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if (((long)local_3f0._M_dataplus._M_p < 0) ||
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x136;
                  goto LAB_00322738;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x13b);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  uVar16 = (ulong)local_430 & 0xffffffff;
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ke ",7);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((pointer)uVar13 == (pointer)0x0) goto LAB_003260f3;
              }
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pRVar8[uVar29].surfaceShader.opacity.texture_id < 0) {
                local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.opacity.value;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"d ",2);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              }
              else {
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.opacity.texture_id;
                uVar37 = (uint)uVar16;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x147;
                  goto LAB_00324867;
                }
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if (((long)local_3f0._M_dataplus._M_p < 0) ||
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x14c;
                  goto LAB_00322738;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x151);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  uVar16 = (ulong)local_430 & 0xffffffff;
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_d ",6);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((pointer)uVar13 == (pointer)0x0) goto LAB_003260f3;
              }
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pRVar8[uVar29].surfaceShader.clearcoat.texture_id < 0) {
                local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.clearcoat.value;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pc ",3);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              }
              else {
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.clearcoat.texture_id;
                uVar37 = (uint)uVar16;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x15d;
                  goto LAB_00324867;
                }
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if (((long)local_3f0._M_dataplus._M_p < 0) ||
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x162;
                  goto LAB_00322738;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x167);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  uVar16 = (ulong)local_430 & 0xffffffff;
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Pc ",7);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((pointer)uVar13 == (pointer)0x0) goto LAB_003260f3;
              }
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar37 = (uint)uVar16;
              if (pRVar8[uVar29].surfaceShader.clearcoatRoughness.texture_id < 0) {
                local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.clearcoatRoughness.value;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pcr ",4);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              }
              else {
                local_41c = (undefined1  [4])
                            pRVar8[uVar29].surfaceShader.clearcoatRoughness.texture_id;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x172;
                  goto LAB_00324867;
                }
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if (((long)local_3f0._M_dataplus._M_p < 0) ||
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x177;
                  goto LAB_00322738;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                pRVar33 = (pointer)local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  local_430 = (pointer)local_468._8_8_;
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x17c);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                  pRVar33 = local_430;
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Pcr ",8);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if (pRVar33 == (pointer)0x0) goto LAB_003260f3;
              }
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pRVar8[uVar29].surfaceShader.ior.texture_id < 0) {
                local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.clearcoatRoughness.value;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ni ",3);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              }
              else {
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.ior.texture_id;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x187;
                  goto LAB_00324867;
                }
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if (((long)local_3f0._M_dataplus._M_p < 0) ||
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x18c);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_490,"Invalid image id {}. scene.images.size = {}","");
                  local_418._M_dataplus._M_p =
                       (pointer)(((long)(local_428->images).
                                        super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_428->images).
                                        super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                -0x3333333333333333);
                  fmt::format<long,unsigned_long>
                            ((string *)local_468,(fmt *)&local_490,&local_3f0,
                             (long *)(local_41c + 4),(unsigned_long *)warn);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_)
                  ;
                  goto LAB_0032234b;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x191);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ni ",7);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((pointer)uVar13 == (pointer)0x0) goto LAB_003260f3;
              }
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pRVar8[uVar29].surfaceShader.occlusion.texture_id < 0) {
                local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.occlusion.value;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ka ",3);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              }
              else {
                local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.occlusion.texture_id;
                if (((long)(int)local_41c < 0) ||
                   (pUVar9 = (local_428->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   (int)((ulong)((long)(local_428->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >>
                        3) * 0x2fa0be83 <= (int)local_41c)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  iVar31 = 0x19d;
                  goto LAB_00324867;
                }
                local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
                if (((long)local_3f0._M_dataplus._M_p < 0) ||
                   (pTVar10 = (local_428->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   lVar38 = (long)(local_428->images).
                                  super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                   SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) ==
                   (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                  local_3f0.field_2._M_allocated_capacity = uVar34;
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x1a2);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_490,"Invalid image id {}. scene.images.size = {}","");
                  local_418._M_dataplus._M_p =
                       (pointer)(((long)(local_428->images).
                                        super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_428->images).
                                        super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                -0x3333333333333333);
                  fmt::format<long,unsigned_long>
                            ((string *)local_468,(fmt *)&local_490,&local_3f0,
                             (long *)(local_41c + 4),(unsigned_long *)warn);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_490);
                    pp_Var2 = (__node_base_ptr *)(puVar26 + 2);
                    if ((__node_base_ptr *)*puVar26 == pp_Var2) {
                      local_468._16_8_ = *pp_Var2;
                      local_468._24_8_ = puVar26[3];
                      local_468._0_8_ = local_468 + 0x10;
                    }
                    else {
                      local_468._16_8_ = *pp_Var2;
                      local_468._0_8_ = (__node_base_ptr *)*puVar26;
                    }
                    local_468._8_8_ = puVar26[1];
                    *puVar26 = pp_Var2;
                    puVar26[1] = 0;
                    *(undefined1 *)(puVar26 + 2) = 0;
                    ::std::__cxx11::string::_M_append((char *)local_470,local_468._0_8_);
                    if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                      operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                  iVar31 = 1;
                  uVar16 = (ulong)local_430 & 0xffffffff;
                  uVar34 = local_3f0.field_2._M_allocated_capacity;
                  goto LAB_00325cce;
                }
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x1a7);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ka ",7);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                uVar16 = (ulong)local_430 & 0xffffffff;
                if ((pointer)uVar13 == (pointer)0x0) goto LAB_003260f3;
              }
              pRVar8 = (local_428->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pRVar8[uVar29].surfaceShader.ior.texture_id < 0) {
                local_430 = (pointer)(double)pRVar8[uVar29].surfaceShader.clearcoatRoughness.value;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ni ",3);
                poVar17 = ::std::ostream::_M_insert<double>((double)local_430);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
LAB_003250e7:
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                iVar31 = 0;
                goto LAB_00325cce;
              }
              local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.ior.texture_id;
              if (((long)(int)local_41c < 0) ||
                 (pUVar9 = (local_428->textures).
                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                 (int)((ulong)((long)(local_428->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 3
                      ) * 0x2fa0be83 <= (int)local_41c)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x1b3);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_490,"Invalid texture id {}. scene.textures.size = {}",""
                          );
                local_418._M_dataplus._M_p =
                     (pointer)(((long)(local_428->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_428->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x7d05f417d05f417d);
                fmt::format<int,unsigned_long>
                          ((string *)local_468,(fmt *)&local_490,(string *)local_41c,
                           (int *)(local_41c + 4),(unsigned_long *)warn);
                poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                if (local_470 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_490);
                  pp_Var2 = (__node_base_ptr *)(puVar26 + 2);
                  if ((__node_base_ptr *)*puVar26 == pp_Var2) {
                    local_468._16_8_ = *pp_Var2;
                    local_468._24_8_ = puVar26[3];
                    local_468._0_8_ = local_468 + 0x10;
                  }
                  else {
                    local_468._16_8_ = *pp_Var2;
                    local_468._0_8_ = (__node_base_ptr *)*puVar26;
                  }
                  local_468._8_8_ = puVar26[1];
                  *puVar26 = pp_Var2;
                  puVar26[1] = 0;
                  *(undefined1 *)(puVar26 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_470,local_468._0_8_);
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                ::std::ios_base::~ios_base(local_300);
LAB_003260f3:
                iVar31 = 1;
                goto LAB_00325cce;
              }
              local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
              if ((-1 < (long)local_3f0._M_dataplus._M_p) &&
                 (pTVar10 = (local_428->images).
                            super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 lVar38 = (long)(local_428->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                 SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) !=
                 (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x1bd);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Ni ",7);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((pointer)uVar13 != (pointer)0x0) goto LAB_003250e7;
                goto LAB_003260f3;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,"export_to_obj",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
              poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_490,"Invalid image id {}. scene.images.size = {}","");
              local_418._M_dataplus._M_p =
                   (pointer)(((long)(local_428->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_428->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x3333333333333333);
              fmt::format<long,unsigned_long>
                        ((string *)local_468,(fmt *)&local_490,&local_3f0,(long *)(local_41c + 4),
                         (unsigned_long *)warn);
              poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_490._M_dataplus._M_p != &local_490.field_2) {
                operator_delete(local_490._M_dataplus._M_p,
                                local_490.field_2._M_allocated_capacity + 1);
              }
              if (local_470 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_490);
                local_468._0_8_ = local_468 + 0x10;
                pp_Var2 = (__node_base_ptr *)(puVar26 + 2);
                if ((__node_base_ptr *)*puVar26 == pp_Var2) {
                  local_468._16_8_ = *pp_Var2;
                  local_468._24_8_ = puVar26[3];
                }
                else {
                  local_468._16_8_ = *pp_Var2;
                  local_468._0_8_ = (__node_base_ptr *)*puVar26;
                }
                local_468._8_8_ = puVar26[1];
                *puVar26 = pp_Var2;
                puVar26[1] = 0;
                *(undefined1 *)(puVar26 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_470,local_468._0_8_);
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p == &local_490.field_2) goto LAB_00325ca1;
                goto LAB_00322821;
              }
            }
            else {
              local_41c = (undefined1  [4])pRVar8[uVar29].surfaceShader.diffuseColor.texture_id;
              if (((long)(int)local_41c < 0) ||
                 (pUVar9 = (local_428->textures).
                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                 (int)((ulong)((long)(local_428->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 3
                      ) * 0x2fa0be83 <= (int)local_41c)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_370,"export_to_obj",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0xda);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_490,"Invalid texture id {}. scene.textures.size = {}",""
                          );
                local_418._M_dataplus._M_p =
                     (pointer)(((long)(local_428->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_428->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x7d05f417d05f417d);
                fmt::format<int,unsigned_long>
                          ((string *)local_468,(fmt *)&local_490,(string *)local_41c,
                           (int *)(local_41c + 4),(unsigned_long *)warn);
                poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_);
LAB_0032234b:
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
LAB_00322376:
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00322383;
              }
              local_3f0._M_dataplus._M_p = (pointer)pUVar9[(int)local_41c].texture_image_id;
              uVar37 = (uint)uVar16;
              if ((-1 < (long)local_3f0._M_dataplus._M_p) &&
                 (pTVar10 = (local_428->images).
                            super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 lVar38 = (long)(local_428->images).
                                super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 4,
                 SBORROW8((long)local_3f0._M_dataplus._M_p,lVar38 * -0x3333333333333333) !=
                 (long)(local_3f0._M_dataplus._M_p + lVar38 * 0x3333333333333333) < 0)) {
                local_468._0_8_ = local_468 + 0x10;
                _Var24._M_p = pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier._M_dataplus
                              ._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_468,_Var24._M_p,
                           _Var24._M_p +
                           pTVar10[(long)local_3f0._M_dataplus._M_p].asset_identifier.
                           _M_string_length);
                uVar13 = local_468._8_8_;
                if ((pointer)local_468._8_8_ == (pointer)0x0) {
                  local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_370,"export_to_obj",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0xe4);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_41c + 4),"Filename for image id {} is empty.","");
                  fmt::format<long>(&local_490,(string *)(local_41c + 4),(long *)&local_3f0);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_370,local_490._M_dataplus._M_p,
                                       local_490._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                  }
                  uVar16 = (ulong)local_430 & 0xffffffff;
                  if (local_470 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                    psVar1 = (size_type *)(plVar27 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490.field_2._8_8_ = plVar27[3];
                      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                    }
                    else {
                      local_490.field_2._M_allocated_capacity = *psVar1;
                      local_490._M_dataplus._M_p = (pointer)*plVar27;
                    }
                    local_490._M_string_length = plVar27[1];
                    *plVar27 = (long)psVar1;
                    plVar27[1] = 0;
                    *(undefined1 *)(plVar27 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
                  ::std::ios_base::~ios_base(local_300);
                }
                else {
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"map_Kd ",7);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_468._0_8_,local_468._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                }
                if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                  operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
                }
                if ((pointer)uVar13 != (pointer)0x0) goto LAB_0032248b;
                goto LAB_003260f3;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,"export_to_obj",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
              iVar31 = 0xdf;
LAB_00322738:
              poVar17 = (ostream *)::std::ostream::operator<<(local_370,iVar31);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_490,"Invalid image id {}. scene.images.size = {}","");
              local_418._M_dataplus._M_p =
                   (pointer)(((long)(local_428->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_428->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x3333333333333333);
              fmt::format<long,unsigned_long>
                        ((string *)local_468,(fmt *)&local_490,&local_3f0,(long *)(local_41c + 4),
                         (unsigned_long *)warn);
LAB_003248ef:
              poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_370,(char *)local_468._0_8_,local_468._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              pp_Var2 = (__node_base_ptr *)(local_468 + 0x10);
              if ((__node_base_ptr *)local_468._0_8_ != pp_Var2) {
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
              uVar16 = (ulong)uVar37;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_490._M_dataplus._M_p != &local_490.field_2) {
                operator_delete(local_490._M_dataplus._M_p,
                                local_490.field_2._M_allocated_capacity + 1);
              }
              if (local_470 == (string *)0x0) goto LAB_00325ca1;
              ::std::__cxx11::stringbuf::str();
              puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_490);
              pp_Var3 = (__node_base_ptr *)(puVar26 + 2);
              if ((__node_base_ptr *)*puVar26 == pp_Var3) {
                local_468._16_8_ = *pp_Var3;
                local_468._24_8_ = puVar26[3];
                local_468._0_8_ = pp_Var2;
              }
              else {
                local_468._16_8_ = *pp_Var3;
                local_468._0_8_ = (__node_base_ptr *)*puVar26;
              }
              local_468._8_8_ = puVar26[1];
              *puVar26 = pp_Var3;
              puVar26[1] = 0;
              *(undefined1 *)(puVar26 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_470,local_468._0_8_);
              if ((__node_base_ptr *)local_468._0_8_ != pp_Var2) {
LAB_00322806:
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
LAB_00322813:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_490._M_dataplus._M_p != &local_490.field_2) {
LAB_00322821:
                operator_delete(local_490._M_dataplus._M_p,
                                local_490.field_2._M_allocated_capacity + 1);
              }
            }
LAB_00325ca1:
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
            ::std::ios_base::~ios_base(local_300);
            iVar31 = 1;
          }
LAB_00325cce:
          if ((iVar31 != 0x2f) && (iVar31 != 0)) goto LAB_00326185;
          uVar34 = (((_Vector_impl *)&(((pointer)uVar34)->prim_name)._M_dataplus)->
                   super__Vector_impl_data)._M_start;
          bVar44 = (pointer)uVar34 == (pointer)0x0;
          uVar16 = CONCAT71((int7)(uVar16 >> 8),bVar44);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"# ",2);
        poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," materials.\n",0xc);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)local_1e0,(string *)local_370);
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_370._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)&local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_p + 1));
        }
LAB_00326185:
        bVar36 = (byte)uVar16;
        if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        local_468._0_8_ = &p_Stack_438;
        local_468._8_8_ = (pointer)0x1;
        local_468._16_8_ = (__node_base_ptr)0x0;
        local_468._24_8_ = 0;
        local_448 = 1.0;
        local_440 = 0;
        p_Stack_438 = (__node_base_ptr)0x0;
        pRVar33 = *(pointer *)((long)&(pRVar32->material_subsetMap)._M_t._M_impl + 0x18);
        local_3f0.field_2._M_allocated_capacity =
             (long)&(pRVar32->material_subsetMap)._M_t._M_impl + 8;
        bVar44 = pRVar33 == (pointer)local_3f0.field_2._M_allocated_capacity;
        if (!bVar44) {
          do {
            pvVar11 = &pRVar33->triangulatedFaceVertexCounts;
            pvVar12 = &pRVar33->triangulatedFaceVertexIndices;
            pvVar21 = pvVar11;
            if (*(pointer *)
                 ((long)&(pRVar33->triangulatedFaceVertexCounts).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) ==
                *(pointer *)
                 &(pRVar33->triangulatedFaceVertexCounts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
              pvVar21 = pvVar12;
            }
            local_430 = pRVar33;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_1f8,
                       (long)*(pointer *)
                              ((long)&pvVar21->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              + 8) -
                       *(long *)&pvVar21->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> >>
                       2,(allocator_type *)local_370);
            pvVar21 = pvVar11;
            if (*(pointer *)
                 ((long)&(local_430->triangulatedFaceVertexCounts).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) ==
                *(pointer *)
                 &(local_430->triangulatedFaceVertexCounts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
              pvVar21 = pvVar12;
            }
            puVar20 = *(pointer *)
                       &pvVar21->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
            if (*(pointer *)
                 ((long)&pvVar21->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
                 8) != puVar20) {
              lVar38 = 0;
              uVar16 = 0;
              do {
                *(uint *)((long)local_1f8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar38) = puVar20[uVar16]
                ;
                local_370._0_8_ =
                     (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_468;
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_468,
                           (long)local_1f8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar38,
                           (ostringstream *)local_370);
                uVar16 = uVar16 + 1;
                pvVar21 = pvVar11;
                if (*(pointer *)
                     ((long)&(local_430->triangulatedFaceVertexCounts).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) ==
                    *(pointer *)
                     &(local_430->triangulatedFaceVertexCounts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
                  pvVar21 = pvVar12;
                }
                puVar20 = *(pointer *)
                           &pvVar21->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ;
                lVar38 = lVar38 + 4;
              } while (uVar16 < (ulong)((long)*(pointer *)
                                               ((long)&pvVar21->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               + 8) - (long)puVar20 >> 2));
            }
            sVar6 = (local_430->abs_path)._M_string_length;
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,"export_to_obj",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
              poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x7c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_370,"Empty material_subset name is not allowed.",0x2a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"\n",1);
              if (local_470 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar27 = (long *)::std::__cxx11::string::append(local_41c + 4);
                psVar1 = (size_type *)(plVar27 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar27 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_490.field_2._M_allocated_capacity = *psVar1;
                  local_490.field_2._8_8_ = plVar27[3];
                  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                }
                else {
                  local_490.field_2._M_allocated_capacity = *psVar1;
                  local_490._M_dataplus._M_p = (pointer)*plVar27;
                }
                local_490._M_string_length = plVar27[1];
                *plVar27 = (long)psVar1;
                plVar27[1] = 0;
                *(undefined1 *)(plVar27 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)local_470,(ulong)local_490._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
              ::std::ios_base::~ios_base(local_300);
            }
            else {
              psVar40 = &local_430->abs_path;
              local_370._0_4_ =
                   *(undefined4 *)
                    ((long)&(local_430->usdFaceVertexCounts).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    + 0x10);
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_370 + 8),
                         &local_1f8);
              pmVar22 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_3b0,psVar40);
              pmVar22->first = local_370._0_4_;
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                        (&pmVar22->second,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_370 + 8));
              if ((void *)local_370._8_8_ != (void *)0x0) {
                operator_delete((void *)local_370._8_8_,local_358 - local_370._8_8_);
              }
            }
            pRVar32 = local_3c8;
            if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (sVar6 == 0) {
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_468);
              goto LAB_0032627c;
            }
            pRVar33 = (pointer)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_430);
            bVar44 = pRVar33 == (pointer)local_3f0.field_2._M_allocated_capacity;
          } while (!bVar44);
        }
        local_418._M_dataplus._M_p = (pointer)0x0;
        local_418._M_string_length = 0;
        local_418.field_2._0_8_ = (uint *)0x0;
        lVar38 = 200;
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexCounts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar38 = 0x98;
        }
        if (*(pointer *)
             ((long)&(pRVar32->triangulatedFaceVertexIndices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) ==
            *(pointer *)
             &(pRVar32->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
          lVar38 = 0x98;
        }
        if (*(long *)((long)&(pRVar32->prim_name)._M_string_length + lVar38) !=
            *(long *)((long)&(pRVar32->prim_name)._M_dataplus._M_p + lVar38)) {
          uVar16 = 0;
          do {
            uVar37 = (uint)uVar16;
            local_370._0_4_ = uVar37;
            sVar23 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_468,(key_type_conflict1 *)local_370);
            if (sVar23 == 0) {
              if (local_418._M_string_length == local_418.field_2._0_8_) {
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_41c + 4),
                           (iterator)local_418._M_string_length,(uint *)local_370);
              }
              else {
                *(uint *)local_418._M_string_length = uVar37;
                local_418._M_string_length = local_418._M_string_length + 4;
              }
            }
            lVar38 = 200;
            if (*(pointer *)
                 ((long)&(pRVar32->triangulatedFaceVertexCounts).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8
                 ) == *(pointer *)
                       &(pRVar32->triangulatedFaceVertexCounts).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
              lVar38 = 0x98;
            }
            if (*(pointer *)
                 ((long)&(pRVar32->triangulatedFaceVertexIndices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8
                 ) == *(pointer *)
                       &(pRVar32->triangulatedFaceVertexIndices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl) {
              lVar38 = 0x98;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < (ulong)(*(long *)((long)&(pRVar32->prim_name)._M_string_length + lVar38)
                                    - *(long *)((long)&(pRVar32->prim_name)._M_dataplus._M_p +
                                               lVar38) >> 2));
        }
        local_370._0_4_ = pRVar32->material_id;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_370 + 8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_41c + 4));
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
        pmVar22 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_3b0,&local_490);
        pmVar22->first = local_370._0_4_;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  (&pmVar22->second,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_370 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        if ((void *)local_370._8_8_ != (void *)0x0) {
          operator_delete((void *)local_370._8_8_,local_358 - local_370._8_8_);
        }
        pRVar32 = local_3c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_418._M_dataplus._M_p,
                          local_418.field_2._0_8_ - (long)local_418._M_dataplus._M_p);
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_468);
        if (bVar44) goto LAB_00321b42;
LAB_0032627c:
        bVar36 = 0;
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_3b0);
      goto LAB_003210d6;
    }
    local_370._0_8_ = local_370._0_8_ & 0xffffffff00000000;
    this_00 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this,(key_type *)local_370);
    uVar28 = (undefined7)((ulong)this_00 >> 8);
    local_378 = CONCAT44(local_378._4_4_,(int)CONCAT71(uVar28,this_00->variability == FaceVarying));
    uVar37 = this_00->variability - Vertex;
    if (uVar37 < 2) {
      bVar44 = this_00->format == Vec2;
      local_3cc = (undefined4)CONCAT71(uVar28,bVar44);
      if (bVar44) {
        puVar5 = (this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar19 = VertexAttribute::vertex_count(this_00);
        pRVar30 = (pointer)CONCAT71((int7)((ulong)pRVar30 >> 8),1);
        local_3cc = SUB84(pRVar30,0);
        if (sVar19 != 0) {
          local_430 = (pointer)CONCAT44(local_430._4_4_,uVar37);
          uVar16 = 0;
          do {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vt ",3);
            poVar17 = ::std::ostream::_M_insert<double>((double)*(float *)(puVar5 + uVar16 * 8));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            poVar17 = ::std::ostream::_M_insert<double>((double)*(float *)(puVar5 + uVar16 * 8 + 4))
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            uVar16 = uVar16 + 1;
            sVar19 = VertexAttribute::vertex_count(this_00);
          } while (uVar16 < sVar19);
          pRVar33 = local_3c8;
          uVar37 = (uint)local_430._0_4_;
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_370,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"export_to_obj",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"():",3);
      poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_370,0x52);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_370,
                 "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0",
                 0x49);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"\n",1);
      psVar40 = local_470;
      if (local_470 != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        plVar27 = (long *)::std::__cxx11::string::append(local_468);
        pRVar30 = (pointer)(plVar27 + 2);
        if ((pointer)*plVar27 == pRVar30) {
          local_3a0._0_8_ = (pRVar30->prim_name)._M_dataplus._M_p;
          local_3a0._8_8_ = plVar27[3];
          local_3b0._0_8_ = (pointer)local_3a0;
        }
        else {
          local_3a0._0_8_ = (pRVar30->prim_name)._M_dataplus._M_p;
          local_3b0._0_8_ = (pointer)*plVar27;
        }
        local_3b0._8_8_ = plVar27[1];
        *plVar27 = (long)pRVar30;
        plVar27[1] = 0;
        *(undefined1 *)(plVar27 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar40,local_3b0._0_8_);
        if ((pointer)local_3b0._0_8_ != (pointer)local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
          operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
      ::std::ios_base::~ios_base(local_300);
      local_378 = local_378 & 0xffffffff00000000;
      local_3cc = 0;
    }
    if (uVar37 < 2) goto LAB_0032134f;
  }
  bVar36 = 0;
LAB_003210d6:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return (bool)(bVar36 & 1);
}

Assistant:

bool export_to_obj(const RenderScene &scene, const int mesh_id,
  std::string &obj_str, std::string &mtl_str, std::string *warn, std::string *err) {

  //
  // NOTE:
  //
  // - Export GeomSubset(per-face material) as group(g) + usemtl
  // - Export skin weight as tinyobjloader's 'vw' extension
  //

  (void)obj_str;
  (void)mtl_str;
  (void)warn;

  std::stringstream ss;

  if (mesh_id < 0) {
    PUSH_ERROR_AND_RETURN("Invalid mesh_id");
  } else if (size_t(mesh_id) >= scene.meshes.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("mesh_id {} is out-of-range. scene.meshes.size {}", mesh_id, scene.meshes.size()));
  }

  const RenderMesh &mesh = scene.meshes[size_t(mesh_id)];

  ss << "# exported from TinyUSDZ Tydra.\n";
  ss << "mtllib " << mesh_id << mesh.prim_name + ".mtl";
  ss << "\n";
  
  for (size_t i = 0; i < mesh.points.size(); i++) {
    ss << "v " << mesh.points[i][0] << " " << mesh.points[i][1] << " " << mesh.points[i][2] << "\n";
  } 
  ss << "# " << mesh.points.size() << " vertices\n";

  if (mesh.joint_and_weights.jointWeights.size() == (mesh.points.size() * size_t(mesh.joint_and_weights.elementSize))) {
     
    size_t elementSize = size_t(mesh.joint_and_weights.elementSize); // # of weights per vertex.
    for (size_t i = 0; i < mesh.points.size(); i++) {
      ss << "vw ";
      for (size_t w = 0; w < elementSize; w++) {
        if (w > 0) {
          ss << " ";
        }
        ss << mesh.joint_and_weights.jointIndices[i * elementSize + w] << " " << mesh.joint_and_weights.jointWeights[i * elementSize + w];
      } 
      ss << "\n";
    }
  }

  bool has_texcoord = false;
  bool is_facevarying_texcoord = false;
  bool has_normal = false;
  bool is_facevarying_normal = false;

  // primary texcoord only
  if (mesh.texcoords.count(0)) {
    const VertexAttribute &texcoord = mesh.texcoords.at(0);  
    if (texcoord.variability == VertexVariability::FaceVarying) {
      is_facevarying_texcoord = true;
    } else if (texcoord.variability == VertexVariability::Vertex) {
      is_facevarying_texcoord = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (texcoord.format == VertexAttributeFormat::Vec2) {
      const float *ptr = reinterpret_cast<const float *>(texcoord.buffer());
      for (size_t i = 0; i < texcoord.vertex_count(); i++) {
        ss << "vt " << ptr[2 * i + 0] << " " << ptr[2 * i + 1] << "\n";
      } 

      has_texcoord = true;
    }
  }

  if (!mesh.normals.empty()) {
    if (mesh.normals.variability == VertexVariability::FaceVarying) {
      is_facevarying_normal = true;
    } else if (mesh.normals.variability == VertexVariability::Vertex) {
      is_facevarying_normal = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (mesh.normals.format == VertexAttributeFormat::Vec3) {
      const float *ptr = reinterpret_cast<const float *>(mesh.normals.buffer());
      for (size_t i = 0; i < mesh.normals.vertex_count(); i++) {
        ss << "vn " << ptr[3 * i + 0] << " " << ptr[3 * i + 1] << " " << ptr[3 * i + 2] << "\n";
      } 
      has_normal = true;
    }
  }

  // name -> (mat_id, face_ids)
  std::unordered_map<std::string, std::pair<int, std::vector<uint32_t>>> face_groups;
  if (mesh.material_subsetMap.size()) {

    std::unordered_set<uint32_t> subset_face_ids;

    for (const auto &subset : mesh.material_subsetMap) {
      std::vector<uint32_t> face_ids(subset.second.indices().size());
      for (size_t i = 0; i < subset.second.indices().size(); i++) {
        face_ids[i] = uint32_t(subset.second.indices()[i]); 
        subset_face_ids.insert(face_ids[i]);
      }
      if (subset.first.empty()) {
        PUSH_ERROR_AND_RETURN("Empty material_subset name is not allowed.");
      }
      face_groups[subset.first] = std::make_pair(subset.second.material_id, face_ids);
    }

    // face_ids without materialsubset
    std::vector<uint32_t> face_ids;
    for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
      if (!subset_face_ids.count(uint32_t(i))) {
        face_ids.push_back(uint32_t(i));
      }
    }
    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  } else {
    std::vector<uint32_t> face_ids(mesh.faceVertexCounts().size());
    std::iota(face_ids.begin(), face_ids.end(), 0);

    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  }

  // build face_id -> location in mesh.faceVertexIndices table.
  std::vector<size_t> offsets(mesh.faceVertexCounts().size());
  size_t offset = 0;
  for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
    offsets[i] = offset;
    offset += mesh.faceVertexCounts()[i];
  }

  size_t faceIndexOffset = 0;
  // Assume empty group name is iterated first.
  for (const auto &group : face_groups) {

    if (group.first.size()) {
      ss << "g " << group.first << "\n";
    }

    if (std::get<0>(group.second) > -1) {
      uint32_t mat_id = uint32_t(std::get<0>(group.second));
      ss << "usemtl " << scene.materials[mat_id].name << "\n";
    } 

    const auto &face_ids = std::get<1>(group.second);

    for (size_t i = 0; i < face_ids.size(); i++) {
      ss << "f ";

      for (size_t f = 0; f < mesh.faceVertexCounts()[face_ids[i]]; f++) {
        if (f > 0) {
          ss << " ";
        }
        // obj's index starts with 1.
        uint32_t idx = mesh.faceVertexIndices()[offsets[face_ids[i]] + f] + 1;

        uint32_t t_idx = is_facevarying_texcoord ? uint32_t(faceIndexOffset + f) : idx;
        uint32_t n_idx = is_facevarying_normal ? uint32_t(faceIndexOffset + f) : idx;

        if (has_texcoord && has_normal) {
          ss << idx << "/" << t_idx << "/" << n_idx;
        } else if (has_texcoord) {
          ss << idx << "/" << t_idx;
        } else if (has_normal) {
          ss << idx << "//" << n_idx;
        } else {
          ss << idx;
        }
      }

      faceIndexOffset += mesh.faceVertexIndices()[face_ids[i]];
      ss << "\n";
    }

    ss << "\n";
  }

  obj_str = ss.str();

  ss.str("");
  ss << "# exported from TinyUSDZ Tydra.\n";

  // emit material info
  for (const auto &group : face_groups) {
    if (group.second.first == -1) {
      continue;
    }

    uint32_t mat_id = uint32_t(std::get<0>(group.second));
    ss << "newmtl " << scene.materials[mat_id].name << "\n";

    // Original MTL spec: https://paulbourke.net/dataformats/mtl/
    // Emit PBR material: https://github.com/tinyobjloader/tinyobjloader/blob/release/pbr-mtl.md
    
    if (scene.materials[mat_id].surfaceShader.diffuseColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.diffuseColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Kd " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.diffuseColor.value;
      ss << "Kd " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.useSpecularWorkflow) {
      if (scene.materials[mat_id].surfaceShader.specularColor.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.specularColor.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Ks " << texname << "\n";
      } else {
        const auto col = scene.materials[mat_id].surfaceShader.specularColor.value;
        ss << "Ks " << col[0] << " " << col[1] << " " << col[2] << "\n";
      }
    } else {

      if (scene.materials[mat_id].surfaceShader.metallic.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.metallic.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Pm " << texname << "\n";
      } else {
        const auto f = scene.materials[mat_id].surfaceShader.metallic.value;
        ss << "Pm " << f << "\n";
      }
    }

    if (scene.materials[mat_id].surfaceShader.roughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.roughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.roughness.value;
      ss << "Pr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.emissiveColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.emissiveColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Ke " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.emissiveColor.value;
      ss << "Ke " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }


    if (scene.materials[mat_id].surfaceShader.opacity.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.opacity.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_d " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.opacity.value;
      ss << "d " << f << "\n";
    }

    // emit as cleacoat thickness
    if (scene.materials[mat_id].surfaceShader.clearcoat.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoat.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pc " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoat.value;
      ss << "Pc " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.clearcoatRoughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoatRoughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pcr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Pcr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.occlusion.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.occlusion.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // Use map_ao?
      ss << "map_Ka " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.occlusion.value;
      ss << "Ka " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    // TODO: opacityThreshold

    ss << "\n";
  }
  ss << "# " << face_groups.size() << " materials.\n";

  mtl_str = ss.str();

  return true;
}